

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

bool __thiscall
EthBasePort::ReceiveBroadcastReadResponse(EthBasePort *this,quadlet_t *rdata,uint nbytes)

{
  byte bVar1;
  ostream *poVar2;
  void *this_00;
  ushort local_20;
  byte local_1d;
  uint uStack_1c;
  uchar newHubBoard;
  nodeid_t src_node;
  bool ret;
  uint nbytes_local;
  quadlet_t *rdata_local;
  EthBasePort *this_local;
  
  uStack_1c = nbytes;
  _src_node = rdata;
  rdata_local = (quadlet_t *)this;
  if ((this->useFwBridge & 1U) == 0) {
    local_1d = ReceiveResponseNode(this,0x3f,rdata,nbytes,this->fw_tl,&local_20);
    if ((bool)local_1d) {
      bVar1 = (this->super_BasePort).Node2Board[local_20];
      if (bVar1 < 0x10) {
        if (bVar1 != (this->super_BasePort).HubBoard) {
          (this->super_BasePort).HubBoard = bVar1;
        }
      }
      else {
        poVar2 = std::operator<<((this->super_BasePort).outStr,
                                 "ReceiveBroadcastReadResponse: invalid source node ");
        this_00 = (void *)std::ostream::operator<<(poVar2,local_20);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar2 = std::operator<<((this->super_BasePort).outStr,
                               "ReceiveBroadcastReadResponse failed -- reading from board");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_1d = BasePort::ReceiveBroadcastReadResponse(&this->super_BasePort,_src_node,uStack_1c);
    }
  }
  else {
    local_1d = BasePort::ReceiveBroadcastReadResponse(&this->super_BasePort,rdata,nbytes);
  }
  return (bool)(local_1d & 1);
}

Assistant:

bool EthBasePort::ReceiveBroadcastReadResponse(quadlet_t *rdata, unsigned int nbytes)
{
    bool ret;
    if (useFwBridge) {
        ret = BasePort::ReceiveBroadcastReadResponse(rdata, nbytes);
    }
    else {
        nodeid_t src_node;
        // Use FW_NODE_BROADCAST because we do not care which board responds
        ret = ReceiveResponseNode(FW_NODE_BROADCAST, rdata, nbytes, fw_tl, &src_node);
        if (ret) {
            unsigned char newHubBoard = Node2Board[src_node];
            if (newHubBoard >= BoardIO::MAX_BOARDS) {
                // Should not happen
                outStr << "ReceiveBroadcastReadResponse: invalid source node " << src_node << std::endl;
            }
            else if (newHubBoard != HubBoard) {
                // Not printing message because current hub board is shown in qladisp
                // outStr << "ReceiveBroadcastReadResponse: changing hub board from "
                //        << static_cast<unsigned int>(HubBoard) << " to "
                //        << static_cast<unsigned int>(newHubBoard) << std::endl;
                HubBoard = newHubBoard;
            }
        }
        else {
            outStr << "ReceiveBroadcastReadResponse failed -- reading from board" << std::endl;
            ret = BasePort::ReceiveBroadcastReadResponse(rdata, nbytes);
        }
    }
    return ret;
}